

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O0

void event_track::write_vtt_track_cmaf_header(uint32_t track_id,uint32_t timescale,ostream *ot)

{
  pointer puVar1;
  byte bVar2;
  reference pvVar3;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sparse_moov;
  ostream *ot_local;
  uint32_t timescale_local;
  uint32_t track_id_local;
  
  sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)ot;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,webvtt::base_64_moov,&local_51);
  base64_decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  fmp4_stream::set_track_id
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,track_id);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x1c);
  anon_unknown.dwarf_19776::fmp4_write_uint32(timescale,(char *)pvVar3);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0xf4);
  anon_unknown.dwarf_19776::fmp4_write_uint32(timescale,(char *)pvVar3);
  bVar2 = std::ios::good();
  if ((bVar2 & 1) != 0) {
    std::ostream::write((char *)sparse_moov.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,0x127a10);
    puVar1 = sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    std::ostream::write((char *)puVar1,(long)pvVar3);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

void event_track::write_vtt_track_cmaf_header(uint32_t track_id, uint32_t timescale, std::ostream& ot)
{
	std::vector<uint8_t> sparse_moov = base64_decode(webvtt::base_64_moov);
	
	set_track_id(sparse_moov, track_id);
	
	// write back the timescale mvhd / mhd
	fmp4_write_uint32(timescale, (char*)&sparse_moov[28]);
	fmp4_write_uint32(timescale, (char*)&sparse_moov[244]);

	if (ot.good())
	{
		// write the ftyp header  
		ot.write((char*)&sparse_ftyp_vtt[0], 20);
		ot.write((const char*)&sparse_moov[0], sparse_moov.size());
	}

	return;
}